

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O1

void operations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>,viennamath::ct_constant<5l>>
               (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>
                *t,ct_constant<5L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>
  cStack_38;
  double local_30;
  double local_28;
  double local_20;
  
  local_30 = t2;
  local_28 = u2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LHS: ",5);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", RHS: ",7);
  poVar1 = viennamath::operator<<(poVar1,u);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_20 = local_30 + local_28;
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>>
            (&cStack_38,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>>
            ((ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>_>
              *)&cStack_38,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>,viennamath::op_minus<double>,viennamath::ct_constant<5l>>>
            ((ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_constant<5L>_>
              *)&cStack_38,local_30 - local_28);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>>
            ((ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>_>
              *)&cStack_38,local_28 - local_30);
  local_20 = local_30 * local_28;
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>
            ((ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>
              *)&cStack_38,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>>
            ((ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>_>
              *)&cStack_38,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>,viennamath::op_div<double>,viennamath::ct_constant<5l>>>
            ((ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<5L>_>
              *)&cStack_38,local_30 / local_28);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>>
            ((ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>_>
              *)&cStack_38,local_28 / local_30);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}